

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

void lanli_unescape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  size_t mark;
  size_t i;
  size_t size_local;
  uint8_t *data_local;
  lanli_buffer *ob_local;
  
  mark = 0;
  uVar1 = mark;
  while( true ) {
    while( true ) {
      bVar4 = false;
      if (mark < size) {
        bVar4 = data[mark] != '&';
      }
      if (!bVar4) break;
      mark = mark + 1;
    }
    if ((uVar1 == 0) && (size <= mark)) break;
    if (uVar1 < mark) {
      lanli_buffer_put(ob,data + uVar1,mark - uVar1);
    }
    if (size <= mark) {
      return;
    }
    lVar2 = mark + 1;
    sVar3 = unescape_entity(ob,data + lVar2,size - lVar2);
    mark = sVar3 + lVar2;
    uVar1 = mark;
  }
  lanli_buffer_put(ob,data,size);
  return;
}

Assistant:

void lanli_unescape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && data[i] != '&') i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    i++;
    i += unescape_entity(ob, data + i, size - i);
  }
}